

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

float deqp::gles3::Performance::vectorFloatFirstQuartile<long>
                (vector<long,_std::allocator<long>_> *v)

{
  float fVar1;
  vector<long,_std::allocator<long>_> local_28;
  vector<long,_std::allocator<long>_> *local_10;
  vector<long,_std::allocator<long>_> *v_local;
  
  local_10 = v;
  vectorLowestPercentage<long>(&local_28,v,0.5);
  fVar1 = vectorFloatMedian<long>(&local_28);
  std::vector<long,_std::allocator<long>_>::~vector(&local_28);
  return fVar1;
}

Assistant:

static float vectorFloatFirstQuartile (const vector<T>& v)
{
	return vectorFloatMedian(vectorLowestPercentage(v, 0.5f));
}